

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void jinit_forward_dct(j_compress_ptr cinfo)

{
  jpeg_forward_dct *pjVar1;
  long lVar2;
  
  pjVar1 = (jpeg_forward_dct *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x138);
  cinfo->fdct = pjVar1;
  pjVar1->start_pass = start_pass_fdctmgr;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    pjVar1[1].forward_DCT[lVar2 + 9] = (forward_DCT_ptr)0x0;
    pjVar1[3].forward_DCT[lVar2 + 1] = (forward_DCT_ptr)0x0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_forward_dct (j_compress_ptr cinfo)
{
  my_fdct_ptr fdct;
  int i;

  fdct = (my_fdct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_fdct_controller));
  cinfo->fdct = (struct jpeg_forward_dct *) fdct;
  fdct->pub.start_pass = start_pass_fdctmgr;

  /* Mark divisor tables unallocated */
  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    fdct->divisors[i] = NULL;
#ifdef DCT_FLOAT_SUPPORTED
    fdct->float_divisors[i] = NULL;
#endif
  }
}